

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fIndexedStateQueryTests.cpp
# Opt level: O2

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::EnableBlendCase::iterate(EnableBlendCase *this)

{
  TestLog *pTVar1;
  int iVar2;
  GLenum err;
  undefined4 extraout_var;
  int ndx;
  uint uVar3;
  allocator<char> local_de;
  allocator<char> local_dd;
  deInt32 maxDrawBuffers;
  ScopedLogSection section;
  string local_d0;
  CallLogWrapper gl;
  string local_98;
  ResultCollector result;
  
  iVar2 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  glu::CallLogWrapper::CallLogWrapper
            (&gl,(Functions *)CONCAT44(extraout_var,iVar2),
             ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log);
  pTVar1 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_d0," // ERROR: ",(allocator<char> *)&local_98);
  tcu::ResultCollector::ResultCollector(&result,pTVar1,&local_d0);
  std::__cxx11::string::~string((string *)&local_d0);
  maxDrawBuffers = 0;
  gl.m_enableLog = true;
  glu::CallLogWrapper::glGetIntegerv(&gl,0x8824,&maxDrawBuffers);
  err = glu::CallLogWrapper::glGetError(&gl);
  glu::checkError(err,"glGetIntegerv",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fIndexedStateQueryTests.cpp"
                  ,0x378);
  pTVar1 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_d0,"Initial",&local_dd);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,"Initial value",&local_de);
  tcu::ScopedLogSection::ScopedLogSection(&section,pTVar1,&local_d0,&local_98);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_d0);
  for (iVar2 = 0; iVar2 < maxDrawBuffers; iVar2 = iVar2 + 1) {
    deqp::gls::StateQueryUtil::verifyStateIndexedBoolean
              (&result,&gl,0xbe2,iVar2,false,this->m_verifierType);
  }
  tcu::ScopedLogSection::~ScopedLogSection(&section);
  pTVar1 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_d0,"AfterSettingCommon",&local_dd);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_98,"After setting common",&local_de);
  tcu::ScopedLogSection::ScopedLogSection(&section,pTVar1,&local_d0,&local_98);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_d0);
  glu::CallLogWrapper::glEnable(&gl,0xbe2);
  for (iVar2 = 0; iVar2 < maxDrawBuffers; iVar2 = iVar2 + 1) {
    deqp::gls::StateQueryUtil::verifyStateIndexedBoolean
              (&result,&gl,0xbe2,iVar2,true,this->m_verifierType);
  }
  tcu::ScopedLogSection::~ScopedLogSection(&section);
  pTVar1 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_d0,"AfterSettingIndexed",&local_dd);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_98,"After setting indexed",&local_de);
  tcu::ScopedLogSection::ScopedLogSection(&section,pTVar1,&local_d0,&local_98);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_d0);
  for (uVar3 = 0; (int)uVar3 < maxDrawBuffers; uVar3 = uVar3 + 1) {
    if ((uVar3 & 1) == 0) {
      glu::CallLogWrapper::glEnablei(&gl,0xbe2,uVar3);
    }
    else {
      glu::CallLogWrapper::glDisablei(&gl,0xbe2,uVar3);
    }
  }
  for (uVar3 = 0; (int)uVar3 < maxDrawBuffers; uVar3 = uVar3 + 1) {
    deqp::gls::StateQueryUtil::verifyStateIndexedBoolean
              (&result,&gl,0xbe2,uVar3,(uVar3 & 1) == 0,this->m_verifierType);
  }
  tcu::ScopedLogSection::~ScopedLogSection(&section);
  pTVar1 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_d0,"AfterResettingIndexedWithCommon",&local_dd);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_98,"After resetting indexed with common",&local_de);
  tcu::ScopedLogSection::ScopedLogSection(&section,pTVar1,&local_d0,&local_98);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_d0);
  for (uVar3 = 0; (int)uVar3 < maxDrawBuffers; uVar3 = uVar3 + 1) {
    if ((uVar3 & 1) == 0) {
      glu::CallLogWrapper::glEnablei(&gl,0xbe2,uVar3);
    }
    else {
      glu::CallLogWrapper::glDisablei(&gl,0xbe2,uVar3);
    }
  }
  glu::CallLogWrapper::glEnable(&gl,0xbe2);
  for (iVar2 = 0; iVar2 < maxDrawBuffers; iVar2 = iVar2 + 1) {
    deqp::gls::StateQueryUtil::verifyStateIndexedBoolean
              (&result,&gl,0xbe2,iVar2,true,this->m_verifierType);
  }
  tcu::ScopedLogSection::~ScopedLogSection(&section);
  tcu::ResultCollector::setTestContextResult
            (&result,(this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  tcu::ResultCollector::~ResultCollector(&result);
  glu::CallLogWrapper::~CallLogWrapper(&gl);
  return STOP;
}

Assistant:

EnableBlendCase::IterateResult EnableBlendCase::iterate (void)
{
	glu::CallLogWrapper		gl				(m_context.getRenderContext().getFunctions(), m_testCtx.getLog());
	tcu::ResultCollector	result			(m_testCtx.getLog(), " // ERROR: ");
	deInt32					maxDrawBuffers = 0;

	gl.enableLogging(true);

	gl.glGetIntegerv(GL_MAX_DRAW_BUFFERS, &maxDrawBuffers);
	GLU_EXPECT_NO_ERROR(gl.glGetError(), "glGetIntegerv");

	{
		const tcu::ScopedLogSection section(m_testCtx.getLog(), "Initial", "Initial value");

		for (int ndx = 0; ndx < maxDrawBuffers; ++ndx)
			verifyStateIndexedBoolean(result, gl, GL_BLEND, ndx, false, m_verifierType);
	}
	{
		const tcu::ScopedLogSection	superSection	(m_testCtx.getLog(), "AfterSettingCommon", "After setting common");

		gl.glEnable(GL_BLEND);

		for (int ndx = 0; ndx < maxDrawBuffers; ++ndx)
			verifyStateIndexedBoolean(result, gl, GL_BLEND, ndx, true, m_verifierType);

	}
	{
		const tcu::ScopedLogSection	superSection	(m_testCtx.getLog(), "AfterSettingIndexed", "After setting indexed");

		for (int ndx = 0; ndx < maxDrawBuffers; ++ndx)
		{
			if (ndx % 2 == 0)
				gl.glEnablei(GL_BLEND, ndx);
			else
				gl.glDisablei(GL_BLEND, ndx);
		}

		for (int ndx = 0; ndx < maxDrawBuffers; ++ndx)
			verifyStateIndexedBoolean(result, gl, GL_BLEND, ndx, (ndx % 2 == 0), m_verifierType);
	}
	{
		const tcu::ScopedLogSection	superSection	(m_testCtx.getLog(), "AfterResettingIndexedWithCommon", "After resetting indexed with common");

		for (int ndx = 0; ndx < maxDrawBuffers; ++ndx)
		{
			if (ndx % 2 == 0)
				gl.glEnablei(GL_BLEND, ndx);
			else
				gl.glDisablei(GL_BLEND, ndx);
		}

		gl.glEnable(GL_BLEND);

		for (int ndx = 0; ndx < maxDrawBuffers; ++ndx)
			verifyStateIndexedBoolean(result, gl, GL_BLEND, ndx, true, m_verifierType);
	}

	result.setTestContextResult(m_testCtx);
	return STOP;
}